

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

CourseComponent *
buildGraph(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>_>_>
           *courses,bool debugOn)

{
  vector<CourseComponent_*,_std::allocator<CourseComponent_*>_> *cList;
  Course *this;
  reference root;
  CourseComponent *pCVar1;
  __node_base *p_Var2;
  value_type course;
  allocator local_ba;
  allocator local_b9;
  string local_b8;
  string local_98;
  string local_78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>
  local_58;
  
  this = (Course *)operator_new(0x88);
  std::__cxx11::string::string((string *)&local_78,"Course Planner Root",(allocator *)&local_58);
  std::__cxx11::string::string((string *)&local_98,"",&local_b9);
  std::__cxx11::string::string((string *)&local_b8,"",&local_ba);
  Course::Course(this,&local_78,0,&local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  p_Var2 = &(courses->_M_h)._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>
    ::pair(&local_58,
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>_*>
            *)(p_Var2 + 1));
    cList = local_58.second;
    if (((local_58.second)->
        super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>)._M_impl.
        super__Vector_impl_data._M_start !=
        ((local_58.second)->
        super__Vector_base<CourseComponent_*,_std::allocator<CourseComponent_*>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      root = std::vector<CourseComponent_*,_std::allocator<CourseComponent_*>_>::at
                       (local_58.second,0);
      pCVar1 = buildGraph(root,cList,courses,debugOn);
      (*(this->super_CourseComponent).super_Observer._vptr_Observer[1])(this,pCVar1);
    }
    std::__cxx11::string::~string((string *)&local_58);
  }
  return &this->super_CourseComponent;
}

Assistant:

CourseComponent* buildGraph(const unordered_map<string, vector<CourseComponent*>*>& courses, bool debugOn) {
    
    CourseComponent* root = new Course("Course Planner Root", 0, "", "");
    
    for (auto course : courses) {
        vector<CourseComponent*>* cList = course.second;
        if (!cList->empty()) {
            root->add(buildGraph(&cList->at(0), cList, courses, debugOn));
        }
    }

    return root;
}